

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O2

bool __thiscall SWDParser::IsOperation(SWDParser *this,SWDOperation *tran)

{
  vector<SWDBit,_std::allocator<SWDBit>_> *__x;
  SWDBit *pSVar1;
  const_iterator cVar2;
  undefined8 uVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  pointer pSVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  pointer pSVar12;
  SWDBit bit;
  SWDBit local_58;
  
  SWDOperation::Clear(tran);
  BufferBits(this,0xc);
  __x = &this->mBitsBuffer;
  pSVar12 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar4 = 0;
  for (lVar9 = 0; lVar9 != 0x140; lVar9 = lVar9 + 0x28) {
    bVar4 = bVar4 >> 1 | (*(int *)((long)&pSVar12->state_rising + lVar9) == 1) << 7;
  }
  tran->request_byte = bVar4;
  if ((bVar4 & 0xc1) == 0x81) {
    tran->APnDP = (bool)(bVar4 >> 1 & 1);
    tran->RnW = (bool)(bVar4 >> 2 & 1);
    tran->addr = bVar4 >> 1 & 0xc;
    bVar5 = (bool)(bVar4 >> 5 & 1);
    tran->parity_read = bVar5;
    if ((((pSVar12[4].state_rising != BIT_HIGH) != (pSVar12[3].state_rising == BIT_HIGH)) !=
        ((pSVar12[2].state_rising == BIT_HIGH) != (pSVar12[1].state_rising == BIT_HIGH))) != bVar5)
    {
      SWDOperation::SetRegister(tran,this->mSelectRegister);
      pSVar12 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar4 = (pSVar12[0xb].state_rising == BIT_HIGH) << 2 |
              (pSVar12[10].state_rising == BIT_HIGH) * '\x02' | pSVar12[9].state_rising == BIT_HIGH;
      tran->ACK = bVar4;
      if (bVar4 == 1) {
        BufferBits(this,0x2d);
        pSVar12 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (tran->RnW == false) {
          BufferBits(this,0x2e);
          pSVar12 = pSVar12 + 0xd;
        }
        else {
          pSVar12 = pSVar12 + 0xc;
        }
        uVar6 = 0;
        bVar4 = 0;
        for (lVar9 = 0; lVar9 != 0x500; lVar9 = lVar9 + 0x28) {
          uVar7 = uVar6 >> 1;
          bVar5 = *(int *)((long)&pSVar12->state_rising + lVar9) == 1;
          uVar6 = uVar7 + 0x80000000;
          if (!bVar5) {
            uVar6 = uVar7;
          }
          bVar4 = bVar4 ^ bVar5;
        }
        tran->data = uVar6;
        bVar5 = pSVar12[0x20].state_rising == BIT_HIGH;
        tran->data_parity = bVar5;
        bVar5 = (bool)(bVar4 ^ bVar5);
        bVar10 = (bool)(bVar5 ^ 1);
        tran->data_parity_ok = bVar10;
        if (!bVar5) {
          if ((tran->reg == SWDR_DP_SELECT) && (tran->RnW == false)) {
            this->mSelectRegister = uVar6;
          }
          lVar9 = 0x500;
          do {
            lVar11 = lVar9;
            pSVar8 = (pointer)((long)&pSVar12[1].state_rising + lVar11);
            if ((this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                super__Vector_impl_data._M_finish <= pSVar8) {
              while( true ) {
                ParseBit(&local_58,this);
                bit.low_end = local_58.low_end;
                bit.rising = local_58.rising;
                bit.falling = local_58.falling;
                bit.state_rising = local_58.state_rising;
                bit.state_falling = local_58.state_falling;
                uVar3 = bit._0_8_;
                bit.low_start = local_58.low_start;
                bit.state_rising = local_58.state_rising;
                bit._0_8_ = uVar3;
                if (bit.state_rising == BIT_HIGH) break;
                std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back(__x,&bit);
              }
              std::vector<SWDBit,_std::allocator<SWDBit>_>::operator=(&tran->bits,__x);
              pSVar12 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if ((this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_finish != pSVar12) {
                (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                super__Vector_impl_data._M_finish = pSVar12;
              }
              std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back(__x,&bit);
              return bVar10;
            }
            lVar9 = lVar11 + 0x28;
          } while (pSVar8->state_rising != BIT_HIGH);
          pSVar12 = (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_finish != pSVar12) {
            (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_finish = pSVar12;
          }
          pSVar1 = (__x->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<SWDBit*,std::back_insert_iterator<std::vector<SWDBit,std::allocator<SWDBit>>>>
                    (pSVar1,(SWDBit *)((long)&pSVar1[1].state_rising + lVar11),
                     (back_insert_iterator<std::vector<SWDBit,_std::allocator<SWDBit>_>_>)
                     &tran->bits);
          cVar2._M_current =
               (__x->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
               super__Vector_impl_data._M_start;
          std::vector<SWDBit,_std::allocator<SWDBit>_>::erase
                    (__x,cVar2,(SWDBit *)((long)&cVar2._M_current[1].state_rising + lVar11));
          return bVar10;
        }
      }
      else if ((bVar4 == 4) || (bVar4 == 2)) {
        pSVar12 = (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_finish != pSVar12) {
          (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_finish = pSVar12;
        }
        pSVar1 = (__x->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<SWDBit*,std::back_insert_iterator<std::vector<SWDBit,std::allocator<SWDBit>>>>
                  (pSVar1,pSVar1 + 0xc,
                   (back_insert_iterator<std::vector<SWDBit,_std::allocator<SWDBit>_>_>)&tran->bits)
        ;
        cVar2._M_current =
             (__x->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
             super__Vector_impl_data._M_start;
        std::vector<SWDBit,_std::allocator<SWDBit>_>::erase(__x,cVar2,cVar2._M_current + 0xc);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SWDParser::IsOperation( SWDOperation& tran )
{
    tran.Clear();

    // read enough bits so that we don't have to worry of subscripts out of range
    BufferBits( TRAN_REQ_AND_ACK );

    // turn the bits into a byte
    tran.request_byte = 0;
    for( size_t cnt = 0; cnt < 8; ++cnt )
    {
        tran.request_byte >>= 1;
        tran.request_byte |= ( mBitsBuffer[ cnt ].IsHigh() ? 0x80 : 0 );
    }

    // are the request's constant bits (start, stop & park) wrong?
    if( ( tran.request_byte & 0xC1 ) != 0x81 )
        return false;

    // get the indivitual bits
    tran.APnDP = ( tran.request_byte & 0x02 ) != 0;                   //(mBitsBuffer[1].state_falling == BIT_HIGH);
    tran.RnW = ( tran.request_byte & 0x04 ) != 0;                     //(mBitsBuffer[2].state_falling == BIT_HIGH);
    tran.addr = ( tran.request_byte & 0x18 ) >> 1;                    //(mBitsBuffer[3].state_falling == BIT_HIGH ? (1<<2) : 0)
                                                                      //| (mBitsBuffer[4].state_falling == BIT_HIGH ? (1<<3) : 0);
    tran.parity_read = ( ( tran.request_byte & 0x20 ) != 0 ? 1 : 0 ); //(mBitsBuffer[5].state_falling == BIT_HIGH ? 1 : 0);

    // check parity
    int check = ( mBitsBuffer[ 1 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 2 ].state_rising == BIT_HIGH ? 1 : 0 ) +
                ( mBitsBuffer[ 3 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 4 ].state_rising == BIT_HIGH ? 1 : 0 );

    if( tran.parity_read != ( check & 1 ) )
        return false;

    // Set the actual register in this operation based on the data from the request
    // and the previous select register state.
    tran.SetRegister( mSelectRegister );

    // get the ACK value
    tran.ACK = ( mBitsBuffer[ 9 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 10 ].state_rising == BIT_HIGH ? 2 : 0 ) +
               ( mBitsBuffer[ 11 ].state_rising == BIT_HIGH ? 4 : 0 );

    // we're only handling OK, WAIT and FAULT responses
    if( tran.ACK == ACK_WAIT || tran.ACK == ACK_FAULT )
    {
        // copy this operation's bits
        tran.bits.clear();
        std::copy( mBitsBuffer.begin(), mBitsBuffer.begin() + TRAN_REQ_AND_ACK, std::back_inserter( tran.bits ) );

        // consume this operation's bits
        mBitsBuffer.erase( mBitsBuffer.begin(), mBitsBuffer.begin() + TRAN_REQ_AND_ACK );

        return true;
    }

    if( tran.ACK != ACK_OK )
        return false;

    BufferBits( TRAN_READ_LENGTH );

    // turnaround if write operation
    bool read_rising = true;
    std::vector<SWDBit>::iterator bi( mBitsBuffer.begin() + 12 );
    if( !tran.IsRead() )
    {
        BufferBits( TRAN_WRITE_LENGTH );
        ++bi;
        // !!! read_rising = false;
    }

    // read the data
    tran.data = 0;
    check = 0;
    size_t ndx;
    for( ndx = 0; ndx < 32; ndx++ )
    {
        tran.data >>= 1;

        if( bi[ ndx ].IsHigh( read_rising ) )
        {
            tran.data |= 0x80000000;
            ++check;
        }
    }

    // data parity
    tran.data_parity = bi[ ndx ].IsHigh( read_rising ) ? 1 : 0;

    tran.data_parity_ok = ( tran.data_parity == ( check & 1 ) );

    if( !tran.data_parity_ok )
        return false;

    // if this is a SELECT register write, remember the value
    if( tran.reg == SWDR_DP_SELECT && !tran.RnW )
        mSelectRegister = tran.data;

    // buffered trailing zeros
    ++ndx;
    bool all_zeros = true;
    while( bi + ndx < mBitsBuffer.end() )
    {
        if( bi[ ndx ].IsHigh( read_rising ) )
        {
            all_zeros = false;
            break;
        }

        ++ndx;
    }

    // if we haven't seen a high bit carry on until we do
    if( all_zeros )
    {
        // read the remaining zero bits
        SWDBit bit;
        while( 1 )
        {
            bit = ParseBit();
            if( bit.IsHigh( read_rising ) )
                break;

            mBitsBuffer.push_back( bit );
        }

        // give the bits to the tran object
        tran.bits = mBitsBuffer;
        mBitsBuffer.clear();

        // keep the high bit because that one is probably next operation's start bit
        mBitsBuffer.push_back( bit );
    }
    else
    {
        // copy this operation's bits
        tran.bits.clear();
        std::copy( mBitsBuffer.begin(), mBitsBuffer.begin() + ndx, std::back_inserter( tran.bits ) );

        // remove this operation's bits from the buffer
        mBitsBuffer.erase( mBitsBuffer.begin(), mBitsBuffer.begin() + ndx );
    }

    return true;
}